

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O3

ChannelUri * aeron::archive::ChannelUri::parse(ChannelUri *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  difference_type __d;
  mapped_type *pmVar5;
  long *plVar6;
  SourcedException *pSVar7;
  char *pcVar8;
  __buckets_ptr pp_Var9;
  ulong uVar10;
  char *pcVar11;
  char cVar12;
  pointer __s2;
  ulong uVar13;
  ChannelUri *this;
  string media;
  string buffer;
  string key;
  string prefix;
  ParamsMap params;
  allocator local_171;
  mapped_type local_170;
  string local_150;
  key_type local_130;
  ChannelUri *local_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  float local_68;
  size_t local_60;
  __node_base_ptr p_Stack_58;
  string local_50;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  __s2 = (str->_M_dataplus)._M_p;
  uVar10 = str->_M_string_length;
  local_110 = __return_storage_ptr__;
  if (uVar10 < DAT_001645d0) {
LAB_00137770:
    uVar13 = 0;
  }
  else {
    if (DAT_001645d0 != 0) {
      iVar4 = bcmp((anonymous_namespace)::SPY_PREFIX_abi_cxx11_,__s2,DAT_001645d0);
      if (iVar4 != 0) goto LAB_00137770;
    }
    std::__cxx11::string::_M_assign((string *)&local_c8);
    __s2 = (str->_M_dataplus)._M_p;
    uVar10 = str->_M_string_length;
    uVar13 = DAT_001645d0;
  }
  sVar3 = DAT_00164630;
  if (DAT_00164630 + (long)(int)uVar13 <= uVar10) {
    if (DAT_00164630 != 0) {
      iVar4 = bcmp((anonymous_namespace)::AERON_PREFIX_abi_cxx11_,__s2 + (int)uVar13,DAT_00164630);
      if (iVar4 != 0) goto LAB_00137af1;
    }
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    local_170._M_string_length = 0;
    local_170.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&local_150);
    uVar13 = sVar3 + uVar13;
    local_88._0_8_ = &p_Stack_58;
    local_88._8_8_ = 1;
    local_88._16_8_ = (_Hash_node_base *)0x0;
    local_88._24_8_ = 0;
    local_68 = 1.0;
    local_60 = 0;
    p_Stack_58 = (__node_base_ptr)0x0;
    if (uVar13 < str->_M_string_length) {
      iVar4 = 0;
      do {
        cVar2 = (str->_M_dataplus)._M_p[uVar13];
        cVar12 = (char)&local_150;
        if (iVar4 == 0) {
          pmVar5 = &local_170;
          if (cVar2 == '?') {
LAB_001378b1:
            iVar4 = 1;
            std::__cxx11::string::_M_assign((string *)pmVar5);
LAB_001378c1:
            local_150._M_string_length = 0;
            *local_150._M_dataplus._M_p = '\0';
          }
          else {
            if (cVar2 == ':') {
              pSVar7 = (SourcedException *)__cxa_allocate_exception(0x48);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_108,"encountered \':\' within media definition","");
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e8,
                         "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)",
                         "");
              pcVar11 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
              ;
              pcVar8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
              ;
              do {
                pcVar8 = pcVar8 + 1;
                pcVar1 = pcVar11 + 1;
                pcVar11 = pcVar11 + 1;
              } while (*pcVar8 == *pcVar1);
              std::__cxx11::string::string
                        ((string *)&local_a8,pcVar11 + (*pcVar1 == '/'),(allocator *)&local_50);
              aeron::util::SourcedException::SourcedException
                        (pSVar7,&local_108,&local_e8,&local_a8,0x91);
              *(undefined ***)pSVar7 = &PTR__SourcedException_00163440;
              __cxa_throw(pSVar7,&aeron::util::IllegalArgumentException::typeinfo,
                          aeron::util::SourcedException::~SourcedException);
            }
            iVar4 = 0;
            std::__cxx11::string::push_back(cVar12);
          }
        }
        else if (iVar4 == 1) {
          if (cVar2 == '=') {
            iVar4 = 2;
            std::__cxx11::string::_M_assign((string *)&local_130);
            goto LAB_001378c1;
          }
          iVar4 = 1;
          std::__cxx11::string::push_back(cVar12);
        }
        else {
          if (cVar2 == '|') {
            pmVar5 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_88,&local_130);
            goto LAB_001378b1;
          }
          iVar4 = 2;
          std::__cxx11::string::push_back(cVar12);
        }
        this = local_110;
        uVar13 = uVar13 + 1;
      } while (uVar13 < str->_M_string_length);
      if (iVar4 == 0) {
        pmVar5 = &local_170;
      }
      else {
        if (iVar4 != 2) {
          pSVar7 = (SourcedException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_e8,iVar4);
          std::operator+(&local_108,"no more input found, state=",&local_e8);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,
                     "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)","");
          pcVar11 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
          ;
          pcVar8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
          ;
          do {
            pcVar8 = pcVar8 + 1;
            pcVar1 = pcVar11 + 1;
            pcVar11 = pcVar11 + 1;
          } while (*pcVar8 == *pcVar1);
          std::__cxx11::string::string((string *)&local_50,pcVar11 + (*pcVar1 == '/'),&local_171);
          aeron::util::SourcedException::SourcedException
                    (pSVar7,&local_108,&local_a8,&local_50,0xc6);
          *(undefined ***)pSVar7 = &PTR__SourcedException_00163440;
          __cxa_throw(pSVar7,&aeron::util::IllegalArgumentException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_88,&local_130);
      }
    }
    else {
      pmVar5 = &local_170;
      this = local_110;
    }
    std::__cxx11::string::_M_assign((string *)pmVar5);
    ChannelUri(this,&local_c8,&local_170,(ParamsMap *)local_88);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,
                      CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                               local_170.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    return this;
  }
LAB_00137af1:
  pSVar7 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::operator+(&local_170,"Aeron URIs must start with \'aeron:\', found: \'",str);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_88._0_8_ = *plVar6;
  pp_Var9 = (__buckets_ptr)(plVar6 + 2);
  if ((__buckets_ptr)local_88._0_8_ == pp_Var9) {
    local_88._16_8_ = *pp_Var9;
    local_88._24_8_ = plVar6[3];
    local_88._0_8_ = local_88 + 0x10;
  }
  else {
    local_88._16_8_ = *pp_Var9;
  }
  local_88._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             "static ChannelUri aeron::archive::ChannelUri::parse(const std::string &)","");
  pcVar11 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ChannelUri.cpp"
  ;
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar8 = pcVar8 + 1;
    pcVar1 = pcVar11 + 1;
    pcVar11 = pcVar11 + 1;
  } while (*pcVar8 == *pcVar1);
  std::__cxx11::string::string
            ((string *)&local_150,pcVar11 + (*pcVar1 == '/'),(allocator *)&local_108);
  aeron::util::SourcedException::SourcedException
            (pSVar7,(string *)local_88,&local_130,&local_150,0x76);
  *(undefined ***)pSVar7 = &PTR__SourcedException_00163440;
  __cxa_throw(pSVar7,&aeron::util::IllegalArgumentException::typeinfo,
              aeron::util::SourcedException::~SourcedException);
}

Assistant:

ChannelUri ChannelUri::parse(const std::string& str) {
    std::size_t position = 0;
    std::string prefix;

    if (startsWith(str, SPY_PREFIX)) {
        prefix = SPY_QUALIFIER;
        position += SPY_PREFIX.size();
    }

    if (!startsWith(str, position, AERON_PREFIX)) {
        throw aeron::util::IllegalArgumentException("Aeron URIs must start with 'aeron:', found: '" + str + "'",
                                                    SOURCEINFO);
    } else {
        position += AERON_PREFIX.size();
    }

    std::string media, key;
    State state = State::MEDIA;

    std::string buffer;
    buffer.reserve(str.size());

    ParamsMap params;

    while (position < str.size()) {
        char c = str[position++];

        switch (state) {
            case State::MEDIA:
                switch (c) {
                    case '?':
                        media = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    case ':':
                        throw aeron::util::IllegalArgumentException("encountered ':' within media definition",
                                                                    SOURCEINFO);

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_KEY:
                switch (c) {
                    case '=':
                        key = buffer;
                        buffer.clear();
                        state = State::PARAMS_VALUE;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            case State::PARAMS_VALUE:
                switch (c) {
                    case '|':
                        params[key] = buffer;
                        buffer.clear();
                        state = State::PARAMS_KEY;
                        break;

                    default:
                        buffer.push_back(c);
                }

                break;

            default:
                throw aeron::util::IllegalStateException("unexpected state=" + std::to_string(static_cast<int>(state)),
                                                         SOURCEINFO);
        }
    }

    switch (state) {
        case State::MEDIA:
            media = buffer;
            break;

        case State::PARAMS_VALUE:
            params[key] = buffer;
            break;

        default:
            throw aeron::util::IllegalArgumentException(
                "no more input found, state=" + std::to_string(static_cast<int>(state)), SOURCEINFO);
    }

    return ChannelUri(prefix, media, std::move(params));
}